

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O1

void buf_free(buf_t *buf)

{
  if (buf == (buf_t *)0x0) {
    __assert_fail("buf != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",0x3e,
                  "void buf_free(buf_t *)");
  }
  if (buf->size != 0) {
    if (buf->data != (uchar *)0x0) {
      free(buf->data);
      buf->data = (uchar *)0x0;
      buf->len = 0;
      buf->size = 0;
      return;
    }
    __assert_fail("buf->data != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",0x40,
                  "void buf_free(buf_t *)");
  }
  __assert_fail("buf->size > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/buf.c",0x3f,
                "void buf_free(buf_t *)");
}

Assistant:

void buf_free(buf_t *buf) {
  assert(buf != NULL);
  assert(buf->size > 0);
  assert(buf->data != NULL);
  
  free(buf->data);
  buf->size = 0;
  buf->len = 0;
  buf->data = NULL;
}